

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void transstring(string_view *beast_str,string *shine_str)

{
  ostream *poVar1;
  long local_1a0;
  stringstream sstr;
  basic_ostream<char,_std::char_traits<char>_> local_190 [376];
  string *local_18;
  string *shine_str_local;
  string_view *beast_str_local;
  
  local_18 = (string *)shine_str;
  shine_str_local = (string *)beast_str;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
  std::ios::clear((int)&local_1a0 + (int)*(undefined8 *)(local_1a0 + -0x18));
  boost::operator<<(local_190,(basic_string_view<char,_std::char_traits<char>_> *)shine_str_local);
  std::operator>>((istream *)&local_1a0,local_18);
  poVar1 = std::operator<<((ostream *)&std::cout,"Here:");
  poVar1 = std::operator<<(poVar1,local_18);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a0);
  return;
}

Assistant:

void transstring(beast::string_view &beast_str, shine::string &shine_str) {
    stringstream sstr;
    sstr.clear();
    sstr << beast_str;
    sstr >> shine_str;
    std::cout << "Here:" << shine_str << std::endl;
}